

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O0

int __thiscall ncnn::Bias::forward_inplace(Bias *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long *in_RSI;
  long lVar6;
  long in_RDI;
  int i;
  float bias;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  int local_16c;
  int local_108;
  
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar4 = in_RSI[6];
  iVar3 = *(int *)((long)in_RSI + 0x34);
  lVar5 = in_RSI[7];
  for (local_108 = 0; local_108 < (int)lVar5; local_108 = local_108 + 1) {
    lVar6 = *in_RSI + in_RSI[8] * (long)local_108 * in_RSI[2];
    fVar1 = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_108 * 4);
    for (local_16c = 0; local_16c < iVar2 * (int)lVar4 * iVar3; local_16c = local_16c + 1) {
      *(float *)(lVar6 + (long)local_16c * 4) = fVar1 + *(float *)(lVar6 + (long)local_16c * 4);
    }
  }
  return 0;
}

Assistant:

int Bias::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_data[q];

        for (int i = 0; i < size; i++)
        {
            ptr[i] += bias;
        }
    }

    return 0;
}